

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

Identifier __thiscall soul::Identifier::Pool::get(Pool *this,string_view newString)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  reference pvVar2;
  type this_00;
  pointer this_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  __normal_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_c8;
  __normal_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_c0;
  const_iterator local_b8;
  undefined1 local_ad;
  allocator<char> local_99;
  pointer local_98;
  string *sharedString;
  char *local_88;
  Pool *local_80;
  char *local_78;
  undefined1 local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_68;
  bool isBeforeHalfway;
  size_t halfway;
  size_t local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  pointer local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  size_t e;
  size_t s;
  Pool *this_local;
  string_view newString_local;
  
  newString_local._M_len = (size_t)newString._M_str;
  this_local = (Pool *)newString._M_len;
  s = (size_t)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  checkAssertion((bool)((bVar1 ^ 0xffU) & 1),"! newString.empty()","get",0x34);
  e = 0;
  elem = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::size(&this->strings);
  do {
    if (elem <= e) {
LAB_0035e71d:
      this_01 = (pointer)operator_new(0x20);
      local_ad = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)this_01,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 &local_99);
      local_ad = 0;
      std::allocator<char>::~allocator(&local_99);
      local_98 = this_01;
      local_c8._M_current =
           (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::
              vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::begin(&this->strings);
      local_c0 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator+(&local_c8,(long)(int)e);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>const*,std::vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
      ::
      __normal_iterator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>*>
                ((__normal_iterator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>const*,std::vector<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
                  *)&local_b8,&local_c0);
      std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
      unique_ptr<std::default_delete<std::__cxx11::string>,void>
                ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
                 &local_d0,local_98);
      std::
      vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::insert(&this->strings,local_b8,(value_type *)&local_d0);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&local_d0);
      Identifier((Identifier *)&newString_local._M_str,local_98);
      return (Identifier)(string *)newString_local._M_str;
    }
    pvVar2 = std::
             vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&this->strings,e);
    local_40 = std::
               unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::get(pvVar2);
    _Var3 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
    halfway = (size_t)this_local;
    local_58 = newString_local._M_len;
    __y._M_str = (char *)newString_local._M_len;
    __y._M_len = (size_t)this_local;
    local_50 = _Var3;
    bVar1 = std::operator==(_Var3,__y);
    if (bVar1) {
      Identifier((Identifier *)&newString_local._M_str,local_40);
      return (Identifier)(string *)newString_local._M_str;
    }
    pbStack_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(&elem->_M_dataplus + e) >> 1);
    local_80 = this_local;
    local_78 = (char *)newString_local._M_len;
    pvVar2 = std::
             vector<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&this->strings,(size_type)pbStack_68);
    this_00 = std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*(pvVar2);
    _Var3 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    local_88 = _Var3._M_str;
    sharedString = (string *)_Var3._M_len;
    __x._M_str = local_78;
    __x._M_len = (size_t)local_80;
    local_69 = std::operator<(__x,_Var3);
    if (pbStack_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e) {
      if (!(bool)local_69) {
        e = e + 1;
      }
      goto LAB_0035e71d;
    }
    if ((bool)local_69) {
      elem = pbStack_68;
    }
    else {
      e = (size_t)pbStack_68;
    }
  } while( true );
}

Assistant:

Identifier get (std::string_view newString)
        {
            SOUL_ASSERT (! newString.empty());

            size_t s = 0;
            size_t e = strings.size();

            while (s < e)
            {
                auto* elem = strings[s].get();

                if (*elem == newString)
                    return Identifier (elem);

                auto halfway = (s + e) / 2;
                bool isBeforeHalfway = (newString < *strings[halfway]);

                if (halfway == s)
                {
                    if (! isBeforeHalfway)
                        ++s;

                    break;
                }

                if (isBeforeHalfway)
                    e = halfway;
                else
                    s = halfway;
            }

            auto* sharedString = new std::string (newString);
            strings.insert (strings.begin() + (int) s, std::unique_ptr<std::string> (sharedString));
            return Identifier (sharedString);
        }